

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::MacroActualArgumentListSyntax::MacroActualArgumentListSyntax
          (MacroActualArgumentListSyntax *this,Token openParen,
          SeparatedSyntaxList<slang::syntax::MacroActualArgumentSyntax> *args,Token closeParen)

{
  bool bVar1;
  size_t in_RDX;
  SyntaxNode *in_RSI;
  SeparatedSyntaxList<slang::syntax::MacroActualArgumentSyntax> *in_RDI;
  pointer in_R8;
  size_t in_R9;
  MacroActualArgumentSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::MacroActualArgumentSyntax> *__range2;
  MacroActualArgumentSyntax *in_stack_ffffffffffffffa0;
  
  SyntaxNode::SyntaxNode((SyntaxNode *)in_RDI,MacroActualArgumentList);
  (in_RDI->super_SyntaxListBase).super_SyntaxNode.previewNode = in_RSI;
  (in_RDI->super_SyntaxListBase).childCount = in_RDX;
  SeparatedSyntaxList<slang::syntax::MacroActualArgumentSyntax>::SeparatedSyntaxList
            ((SeparatedSyntaxList<slang::syntax::MacroActualArgumentSyntax> *)
             in_stack_ffffffffffffffa0,in_RDI);
  in_RDI[1].elements._M_ptr = in_R8;
  in_RDI[1].elements._M_extent._M_extent_value = in_R9;
  in_RDI[1].super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)in_RDI;
  SeparatedSyntaxList<slang::syntax::MacroActualArgumentSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::MacroActualArgumentSyntax> *)0x25ef16);
  SeparatedSyntaxList<slang::syntax::MacroActualArgumentSyntax>::end
            ((SeparatedSyntaxList<slang::syntax::MacroActualArgumentSyntax> *)
             in_stack_ffffffffffffffa0);
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::MacroActualArgumentSyntax>::iterator_base<slang::syntax::MacroActualArgumentSyntax_*>_>
                      ((self_type *)in_stack_ffffffffffffffa0,
                       (iterator_base<slang::syntax::MacroActualArgumentSyntax_*> *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffa0 =
         iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::MacroActualArgumentSyntax>::iterator_base<slang::syntax::MacroActualArgumentSyntax_*>,_false>
         ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::MacroActualArgumentSyntax>::iterator_base<slang::syntax::MacroActualArgumentSyntax_*>,_false>
                      *)0x25ef55);
    (in_stack_ffffffffffffffa0->super_SyntaxNode).parent = (SyntaxNode *)in_RDI;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::MacroActualArgumentSyntax>::iterator_base<slang::syntax::MacroActualArgumentSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::MacroActualArgumentSyntax>::iterator_base<slang::syntax::MacroActualArgumentSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::MacroActualArgumentSyntax>::iterator_base<slang::syntax::MacroActualArgumentSyntax_*>,_false>
                *)in_stack_ffffffffffffffa0);
  }
  return;
}

Assistant:

MacroActualArgumentListSyntax(Token openParen, const SeparatedSyntaxList<MacroActualArgumentSyntax>& args, Token closeParen) :
        SyntaxNode(SyntaxKind::MacroActualArgumentList), openParen(openParen), args(args), closeParen(closeParen) {
        this->args.parent = this;
        for (auto child : this->args)
            child->parent = this;
    }